

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitMemAccess<false,true>
          (WasmBytecodeGenerator *this,WasmOp wasmOp,WasmType *signature,ViewType viewType)

{
  byte bVar1;
  WasmType type;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  WasmBinaryReader *pWVar6;
  WasmRegisterSpace *this_00;
  EmitInfo EVar7;
  WasmCompilationException *this_01;
  WasmBinaryReader *pWVar8;
  EmitInfo EVar9;
  EmitInfo local_40;
  EmitInfo exprInfo;
  
  bVar4 = Threads::IsEnabled();
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x66e,"(!isAtomic || Wasm::Threads::IsEnabled())",
                       "!isAtomic || Wasm::Threads::IsEnabled()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  type = *signature;
  SetUsesMemory(this,0);
  EVar9._1_7_ = 0;
  EVar9.super_EmitInfoBase.location._0_1_ = viewType;
  pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  pWVar8 = pWVar6;
  if (pWVar6 == (WasmBinaryReader *)0x0) {
    pWVar8 = (this->m_module->m_reader).ptr;
  }
  uVar2 = *(uint *)(Js::ArrayBufferView::NaturalAlignment + (long)EVar9 * 4);
  bVar1 = (pWVar8->super_WasmReaderBase).m_currentNode.field_1.mem.alignment;
  if (pWVar6 == (WasmBinaryReader *)0x0) {
    pWVar6 = (this->m_module->m_reader).ptr;
  }
  if (uVar2 < bVar1) {
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"alignment must not be larger than natural");
  }
  else {
    exprInfo = EVar9;
    if (uVar2 == bVar1) {
      uVar2 = (pWVar6->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      local_40 = PopEvalStack(this,FirstLocalType,L"Index expression must be of type i32");
      ReleaseLocation(this,&local_40);
      this_00 = GetRegisterSpace(this,type);
      EVar7.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1c])
                (this->m_writer,0x101,(ulong)EVar7.super_EmitInfoBase.location,
                 (ulong)local_40 & 0xffffffff,(ulong)uVar2,exprInfo);
      EVar7.type = type;
      return EVar7;
    }
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"invalid alignment for atomic RW. Expected %u, got %u",(ulong)uVar2,
               (ulong)bVar1);
  }
  __cxa_throw(this_01,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitMemAccess(WasmOp wasmOp, const WasmTypes::WasmType* signature, Js::ArrayBufferView::ViewType viewType)
{
    Assert(!isAtomic || Wasm::Threads::IsEnabled());
    WasmTypes::WasmType type = signature[0];
    SetUsesMemory(0);

    const uint32 naturalAlignment = Js::ArrayBufferView::NaturalAlignment[viewType];
    const uint32 alignment = GetReader()->m_currentNode.mem.alignment;
    const uint32 offset = GetReader()->m_currentNode.mem.offset;

    if (alignment > naturalAlignment)
    {
        throw WasmCompilationException(_u("alignment must not be larger than natural"));
    }
    if (isAtomic && alignment != naturalAlignment)
    {
        throw WasmCompilationException(_u("invalid alignment for atomic RW. Expected %u, got %u"), naturalAlignment, alignment);
    }

    // Stores
    if (isStore)
    {
        EmitInfo rhsInfo = PopEvalStack(type, _u("Invalid type for store op"));
        EmitInfo exprInfo = PopEvalStack(WasmTypes::I32, _u("Index expression must be of type i32"));
        Js::OpCodeAsmJs op = isAtomic ? Js::OpCodeAsmJs::StArrAtomic : Js::OpCodeAsmJs::StArrWasm;
        m_writer->WasmMemAccess(op, rhsInfo.location, exprInfo.location, offset, viewType);
        ReleaseLocation(&rhsInfo);
        ReleaseLocation(&exprInfo);

        return EmitInfo();
    }

    // Loads
    EmitInfo exprInfo = PopEvalStack(WasmTypes::I32, _u("Index expression must be of type i32"));
    ReleaseLocation(&exprInfo);
    Js::RegSlot resultReg = GetRegisterSpace(type)->AcquireTmpRegister();
    Js::OpCodeAsmJs op = isAtomic ? Js::OpCodeAsmJs::LdArrAtomic : Js::OpCodeAsmJs::LdArrWasm;
    m_writer->WasmMemAccess(op, resultReg, exprInfo.location, offset, viewType);

    return EmitInfo(resultReg, type);
}